

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

SPIRCombinedImageSampler * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::
allocate<unsigned_int&,unsigned_int&,unsigned_int&>
          (ObjectPool<spirv_cross::SPIRCombinedImageSampler> *this,uint *p,uint *p_1,uint *p_2)

{
  uint uVar1;
  SPIRCombinedImageSampler *this_00;
  bool bVar2;
  size_t sVar3;
  SPIRCombinedImageSampler **ppSVar4;
  VariableID local_64;
  VariableID local_60;
  TypeID local_5c;
  SPIRCombinedImageSampler *local_58;
  SPIRCombinedImageSampler *ptr;
  uint local_44;
  SPIRCombinedImageSampler *pSStack_40;
  uint i;
  SPIRCombinedImageSampler *ptr_1;
  uint *puStack_30;
  uint num_objects;
  uint *p_local_2;
  uint *p_local_1;
  uint *p_local;
  ObjectPool<spirv_cross::SPIRCombinedImageSampler> *this_local;
  
  puStack_30 = p_2;
  p_local_2 = p_1;
  p_local_1 = p;
  p_local = (uint *)this;
  bVar2 = VectorView<spirv_cross::SPIRCombinedImageSampler_*>::empty
                    (&(this->vacants).super_VectorView<spirv_cross::SPIRCombinedImageSampler_*>);
  if (bVar2) {
    uVar1 = this->start_object_count;
    sVar3 = VectorView<std::unique_ptr<spirv_cross::SPIRCombinedImageSampler,_spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>_>
            ::size(&(this->memory).
                    super_VectorView<std::unique_ptr<spirv_cross::SPIRCombinedImageSampler,_spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>_>
                  );
    ptr_1._4_4_ = uVar1 << ((byte)sVar3 & 0x1f);
    pSStack_40 = (SPIRCombinedImageSampler *)malloc((ulong)ptr_1._4_4_ * 0x18);
    if (pSStack_40 == (SPIRCombinedImageSampler *)0x0) {
      return (SPIRCombinedImageSampler *)0x0;
    }
    for (local_44 = 0; local_44 < ptr_1._4_4_; local_44 = local_44 + 1) {
      ptr = pSStack_40 + local_44;
      SmallVector<spirv_cross::SPIRCombinedImageSampler_*,_0UL>::push_back(&this->vacants,&ptr);
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRCombinedImageSampler,spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>,8ul>
    ::emplace_back<spirv_cross::SPIRCombinedImageSampler*&>
              ((SmallVector<std::unique_ptr<spirv_cross::SPIRCombinedImageSampler,spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>,8ul>
                *)&this->memory,&stack0xffffffffffffffc0);
  }
  ppSVar4 = VectorView<spirv_cross::SPIRCombinedImageSampler_*>::back
                      (&(this->vacants).super_VectorView<spirv_cross::SPIRCombinedImageSampler_*>);
  local_58 = *ppSVar4;
  SmallVector<spirv_cross::SPIRCombinedImageSampler_*,_0UL>::pop_back(&this->vacants);
  this_00 = local_58;
  TypedID<(spirv_cross::Types)1>::TypedID(&local_5c,*p_local_1);
  TypedID<(spirv_cross::Types)2>::TypedID(&local_60,*p_local_2);
  TypedID<(spirv_cross::Types)2>::TypedID(&local_64,*puStack_30);
  SPIRCombinedImageSampler::SPIRCombinedImageSampler(this_00,local_5c,local_60,local_64);
  return local_58;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}